

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib653.c
# Opt level: O3

int test(char *URL)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  
  iVar1 = curl_global_init(3);
  uVar4 = _stderr;
  if (iVar1 != 0) {
    uVar2 = curl_easy_strerror(iVar1);
    curl_mfprintf(uVar4,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib653.c"
                  ,0x24,iVar1,uVar2);
    return iVar1;
  }
  lVar3 = curl_easy_init();
  if (lVar3 == 0) {
    uVar4 = 0;
    curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib653.c"
                  ,0x25);
    iVar1 = 0x7c;
  }
  else {
    uVar4 = curl_mime_init(lVar3);
    uVar5 = curl_mime_addpart(uVar4);
    curl_mime_name(uVar5,"name");
    curl_mime_data(uVar5,"short value",0xffffffffffffffff);
    iVar1 = curl_easy_setopt(lVar3,0x2712,URL);
    uVar2 = _stderr;
    if (iVar1 == 0) {
      iVar1 = curl_easy_setopt(lVar3,0x2a,1);
      uVar2 = _stderr;
      if (iVar1 == 0) {
        iVar1 = curl_easy_setopt(lVar3,0x29,1);
        uVar2 = _stderr;
        if (iVar1 == 0) {
          iVar1 = curl_easy_setopt(lVar3,0x281d,uVar4);
          uVar2 = _stderr;
          if (iVar1 == 0) {
            iVar1 = curl_easy_setopt(lVar3,0x2b,1);
            uVar2 = _stderr;
            if (iVar1 == 0) {
              iVar1 = curl_easy_perform(lVar3);
              if (iVar1 == 0) {
                curl_mime_data(uVar5,"long value for length change",0xffffffffffffffff);
                iVar1 = curl_easy_perform(lVar3);
              }
              goto LAB_00101468;
            }
            uVar5 = curl_easy_strerror(iVar1);
            uVar6 = 0x30;
          }
          else {
            uVar5 = curl_easy_strerror(iVar1);
            uVar6 = 0x2f;
          }
        }
        else {
          uVar5 = curl_easy_strerror(iVar1);
          uVar6 = 0x2e;
        }
      }
      else {
        uVar5 = curl_easy_strerror(iVar1);
        uVar6 = 0x2d;
      }
    }
    else {
      uVar5 = curl_easy_strerror(iVar1);
      uVar6 = 0x2c;
    }
    curl_mfprintf(uVar2,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib653.c"
                  ,uVar6,iVar1,uVar5);
  }
LAB_00101468:
  curl_mime_free(uVar4);
  curl_easy_cleanup(lVar3);
  curl_global_cleanup();
  return iVar1;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  int res = 0;
  curl_mimepart *field = NULL;
  curl_mime *mime = NULL;

  global_init(CURL_GLOBAL_ALL);
  easy_init(curls);

  mime = curl_mime_init(curls);
  field = curl_mime_addpart(mime);
  curl_mime_name(field, "name");
  curl_mime_data(field, "short value", CURL_ZERO_TERMINATED);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);
  easy_setopt(curls, CURLOPT_VERBOSE, 1L);
  easy_setopt(curls, CURLOPT_MIMEPOST, mime);
  easy_setopt(curls, CURLOPT_NOPROGRESS, 1L);

  res = curl_easy_perform(curls);
  if(res)
    goto test_cleanup;

  /* Alter form and resubmit. */
  curl_mime_data(field, "long value for length change", CURL_ZERO_TERMINATED);
  res = curl_easy_perform(curls);

test_cleanup:
  curl_mime_free(mime);
  curl_easy_cleanup(curls);
  curl_global_cleanup();
  return (int) res; /* return the final return code */
}